

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmCTest.cxx
# Opt level: O1

bool __thiscall
cmCTest::HandleTestActionArgument
          (cmCTest *this,char *ctestExec,size_t *i,
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          *args)

{
  pointer pbVar1;
  pointer pcVar2;
  ulong uVar3;
  bool bVar4;
  int iVar5;
  size_t sVar6;
  ostream *poVar7;
  size_t sVar8;
  bool bVar9;
  string arg;
  ostringstream cmCTestLog_msg;
  long *local_1e8;
  long local_1d8 [2];
  long *local_1c8 [2];
  long local_1b8 [2];
  undefined1 local_1a8 [376];
  
  pbVar1 = (args->
           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           )._M_impl.super__Vector_impl_data._M_start;
  local_1c8[0] = local_1b8;
  pcVar2 = pbVar1[*i]._M_dataplus._M_p;
  std::__cxx11::string::_M_construct<char*>
            ((string *)local_1c8,pcVar2,pcVar2 + pbVar1[*i]._M_string_length);
  iVar5 = std::__cxx11::string::compare((char *)local_1c8);
  if (iVar5 != 0) {
    iVar5 = std::__cxx11::string::compare((char *)local_1c8);
    bVar9 = true;
    if (iVar5 != 0) goto LAB_00292e6a;
  }
  uVar3 = *i;
  pbVar1 = (args->
           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           )._M_impl.super__Vector_impl_data._M_start;
  bVar9 = true;
  if (uVar3 < ((long)(args->
                     super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     )._M_impl.super__Vector_impl_data._M_finish - (long)pbVar1 >> 5) - 1U) {
    this->ProduceXML = true;
    sVar6 = uVar3 + 1;
    *i = sVar6;
    bVar4 = SetTest(this,pbVar1[sVar6]._M_dataplus._M_p,false);
    if (!bVar4) {
      std::__cxx11::ostringstream::ostringstream((ostringstream *)local_1a8);
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)local_1a8,"CTest -T called with incorrect option: ",0x27);
      pbVar1 = (args->
               super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               )._M_impl.super__Vector_impl_data._M_start;
      poVar7 = std::__ostream_insert<char,std::char_traits<char>>
                         ((ostream *)local_1a8,pbVar1[*i]._M_dataplus._M_p,
                          pbVar1[*i]._M_string_length);
      std::ios::widen((char)poVar7->_vptr_basic_ostream[-3] + (char)poVar7);
      std::ostream::put((char)poVar7);
      std::ostream::flush();
      std::__cxx11::stringbuf::str();
      Log(this,6,
          "/workspace/llm4binary/github/license_c_cmakelists/jdavidberger[P]CMake/Source/cmCTest.cxx"
          ,0x868,(char *)local_1e8,false);
      if (local_1e8 != local_1d8) {
        operator_delete(local_1e8,local_1d8[0] + 1);
      }
      std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_1a8);
      std::ios_base::~ios_base((ios_base *)(local_1a8 + 0x70));
      std::__cxx11::ostringstream::ostringstream((ostringstream *)local_1a8);
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)local_1a8,"Available options are:",0x16);
      std::ios::widen((char)(ostream *)local_1a8 + (char)*(_func_int **)(local_1a8._0_8_ + -0x18));
      std::ostream::put((char)local_1a8);
      poVar7 = (ostream *)std::ostream::flush();
      std::__ostream_insert<char,std::char_traits<char>>(poVar7,"  ",2);
      if (ctestExec == (char *)0x0) {
        std::ios::clear((int)poVar7 + (int)poVar7->_vptr_basic_ostream[-3]);
      }
      else {
        sVar8 = strlen(ctestExec);
        std::__ostream_insert<char,std::char_traits<char>>(poVar7,ctestExec,sVar8);
      }
      std::__ostream_insert<char,std::char_traits<char>>(poVar7," -T all",7);
      std::ios::widen((char)poVar7->_vptr_basic_ostream[-3] + (char)poVar7);
      std::ostream::put((char)poVar7);
      poVar7 = (ostream *)std::ostream::flush();
      std::__ostream_insert<char,std::char_traits<char>>(poVar7,"  ",2);
      if (ctestExec == (char *)0x0) {
        std::ios::clear((int)poVar7 + (int)poVar7->_vptr_basic_ostream[-3]);
      }
      else {
        sVar8 = strlen(ctestExec);
        std::__ostream_insert<char,std::char_traits<char>>(poVar7,ctestExec,sVar8);
      }
      std::__ostream_insert<char,std::char_traits<char>>(poVar7," -T start",9);
      std::ios::widen((char)poVar7->_vptr_basic_ostream[-3] + (char)poVar7);
      std::ostream::put((char)poVar7);
      poVar7 = (ostream *)std::ostream::flush();
      std::__ostream_insert<char,std::char_traits<char>>(poVar7,"  ",2);
      if (ctestExec == (char *)0x0) {
        std::ios::clear((int)poVar7 + (int)poVar7->_vptr_basic_ostream[-3]);
      }
      else {
        sVar8 = strlen(ctestExec);
        std::__ostream_insert<char,std::char_traits<char>>(poVar7,ctestExec,sVar8);
      }
      std::__ostream_insert<char,std::char_traits<char>>(poVar7," -T update",10);
      std::ios::widen((char)poVar7->_vptr_basic_ostream[-3] + (char)poVar7);
      std::ostream::put((char)poVar7);
      poVar7 = (ostream *)std::ostream::flush();
      std::__ostream_insert<char,std::char_traits<char>>(poVar7,"  ",2);
      if (ctestExec == (char *)0x0) {
        std::ios::clear((int)poVar7 + (int)poVar7->_vptr_basic_ostream[-3]);
      }
      else {
        sVar8 = strlen(ctestExec);
        std::__ostream_insert<char,std::char_traits<char>>(poVar7,ctestExec,sVar8);
      }
      std::__ostream_insert<char,std::char_traits<char>>(poVar7," -T configure",0xd);
      std::ios::widen((char)poVar7->_vptr_basic_ostream[-3] + (char)poVar7);
      std::ostream::put((char)poVar7);
      poVar7 = (ostream *)std::ostream::flush();
      std::__ostream_insert<char,std::char_traits<char>>(poVar7,"  ",2);
      if (ctestExec == (char *)0x0) {
        std::ios::clear((int)poVar7 + (int)poVar7->_vptr_basic_ostream[-3]);
      }
      else {
        sVar8 = strlen(ctestExec);
        std::__ostream_insert<char,std::char_traits<char>>(poVar7,ctestExec,sVar8);
      }
      std::__ostream_insert<char,std::char_traits<char>>(poVar7," -T build",9);
      std::ios::widen((char)poVar7->_vptr_basic_ostream[-3] + (char)poVar7);
      std::ostream::put((char)poVar7);
      poVar7 = (ostream *)std::ostream::flush();
      std::__ostream_insert<char,std::char_traits<char>>(poVar7,"  ",2);
      if (ctestExec == (char *)0x0) {
        std::ios::clear((int)poVar7 + (int)poVar7->_vptr_basic_ostream[-3]);
      }
      else {
        sVar8 = strlen(ctestExec);
        std::__ostream_insert<char,std::char_traits<char>>(poVar7,ctestExec,sVar8);
      }
      std::__ostream_insert<char,std::char_traits<char>>(poVar7," -T test",8);
      std::ios::widen((char)poVar7->_vptr_basic_ostream[-3] + (char)poVar7);
      std::ostream::put((char)poVar7);
      poVar7 = (ostream *)std::ostream::flush();
      std::__ostream_insert<char,std::char_traits<char>>(poVar7,"  ",2);
      if (ctestExec == (char *)0x0) {
        std::ios::clear((int)poVar7 + (int)poVar7->_vptr_basic_ostream[-3]);
      }
      else {
        sVar8 = strlen(ctestExec);
        std::__ostream_insert<char,std::char_traits<char>>(poVar7,ctestExec,sVar8);
      }
      std::__ostream_insert<char,std::char_traits<char>>(poVar7," -T coverage",0xc);
      std::ios::widen((char)poVar7->_vptr_basic_ostream[-3] + (char)poVar7);
      std::ostream::put((char)poVar7);
      poVar7 = (ostream *)std::ostream::flush();
      std::__ostream_insert<char,std::char_traits<char>>(poVar7,"  ",2);
      if (ctestExec == (char *)0x0) {
        std::ios::clear((int)poVar7 + (int)poVar7->_vptr_basic_ostream[-3]);
      }
      else {
        sVar8 = strlen(ctestExec);
        std::__ostream_insert<char,std::char_traits<char>>(poVar7,ctestExec,sVar8);
      }
      std::__ostream_insert<char,std::char_traits<char>>(poVar7," -T memcheck",0xc);
      std::ios::widen((char)poVar7->_vptr_basic_ostream[-3] + (char)poVar7);
      std::ostream::put((char)poVar7);
      poVar7 = (ostream *)std::ostream::flush();
      std::__ostream_insert<char,std::char_traits<char>>(poVar7,"  ",2);
      if (ctestExec == (char *)0x0) {
        std::ios::clear((int)poVar7 + (int)poVar7->_vptr_basic_ostream[-3]);
      }
      else {
        sVar8 = strlen(ctestExec);
        std::__ostream_insert<char,std::char_traits<char>>(poVar7,ctestExec,sVar8);
      }
      std::__ostream_insert<char,std::char_traits<char>>(poVar7," -T notes",9);
      std::ios::widen((char)poVar7->_vptr_basic_ostream[-3] + (char)poVar7);
      std::ostream::put((char)poVar7);
      poVar7 = (ostream *)std::ostream::flush();
      std::__ostream_insert<char,std::char_traits<char>>(poVar7,"  ",2);
      if (ctestExec == (char *)0x0) {
        std::ios::clear((int)poVar7 + (int)poVar7->_vptr_basic_ostream[-3]);
      }
      else {
        sVar8 = strlen(ctestExec);
        std::__ostream_insert<char,std::char_traits<char>>(poVar7,ctestExec,sVar8);
      }
      std::__ostream_insert<char,std::char_traits<char>>(poVar7," -T submit",10);
      std::ios::widen((char)poVar7->_vptr_basic_ostream[-3] + (char)poVar7);
      std::ostream::put((char)poVar7);
      std::ostream::flush();
      std::__cxx11::stringbuf::str();
      Log(this,6,
          "/workspace/llm4binary/github/license_c_cmakelists/jdavidberger[P]CMake/Source/cmCTest.cxx"
          ,0x874,(char *)local_1e8,false);
      if (local_1e8 != local_1d8) {
        operator_delete(local_1e8,local_1d8[0] + 1);
      }
      std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_1a8);
      std::ios_base::~ios_base((ios_base *)(local_1a8 + 0x70));
      bVar9 = false;
    }
  }
LAB_00292e6a:
  if (local_1c8[0] != local_1b8) {
    operator_delete(local_1c8[0],local_1b8[0] + 1);
  }
  return bVar9;
}

Assistant:

bool cmCTest::HandleTestActionArgument(const char* ctestExec, size_t& i,
                                       const std::vector<std::string>& args)
{
  bool success = true;
  std::string arg = args[i];
  if (this->CheckArgument(arg, "-T", "--test-action") &&
      (i < args.size() - 1)) {
    this->ProduceXML = true;
    i++;
    if (!this->SetTest(args[i].c_str(), false)) {
      success = false;
      cmCTestLog(this, ERROR_MESSAGE, "CTest -T called with incorrect option: "
                   << args[i] << std::endl);
      cmCTestLog(this, ERROR_MESSAGE, "Available options are:"
                   << std::endl
                   << "  " << ctestExec << " -T all" << std::endl
                   << "  " << ctestExec << " -T start" << std::endl
                   << "  " << ctestExec << " -T update" << std::endl
                   << "  " << ctestExec << " -T configure" << std::endl
                   << "  " << ctestExec << " -T build" << std::endl
                   << "  " << ctestExec << " -T test" << std::endl
                   << "  " << ctestExec << " -T coverage" << std::endl
                   << "  " << ctestExec << " -T memcheck" << std::endl
                   << "  " << ctestExec << " -T notes" << std::endl
                   << "  " << ctestExec << " -T submit" << std::endl);
    }
  }
  return success;
}